

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void getProjectGroupFilesRec
               (Output *output,ProjectGroup *group,
               vector<FileInfo,_std::allocator<FileInfo>_> *files)

{
  pointer pbVar1;
  char *path_00;
  pointer puVar2;
  vector<FileInfo,_std::allocator<FileInfo>_> *files_00;
  bool bVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_> *child;
  pointer puVar5;
  ProjectGroup *group_local;
  uint64_t mtime;
  undefined8 uStack_a0;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  vector<FileInfo,_std::allocator<FileInfo>_> *local_88;
  uint64_t size;
  undefined8 local_78;
  code *local_70;
  code *local_68;
  string buf;
  
  pbVar1 = (group->files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  group_local = group;
  for (pbVar4 = (group->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    bVar3 = getFileAttributes((pbVar4->_M_dataplus)._M_p,&mtime,&size);
    if (bVar3) {
      std::__cxx11::string::string((string *)&buf,(string *)pbVar4);
      std::vector<FileInfo,_std::allocator<FileInfo>_>::emplace_back<FileInfo>
                (files,(FileInfo *)&buf);
      std::__cxx11::string::~string((string *)&buf);
    }
    else {
      (*output->_vptr_Output[4])
                (output,"Error reading metadata for file %s\n",(pbVar4->_M_dataplus)._M_p);
    }
  }
  pbVar1 = (group->paths).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = files;
  for (pbVar4 = (group->paths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; files_00 = local_88, pbVar4 != pbVar1;
      pbVar4 = pbVar4 + 1) {
    buf._M_dataplus._M_p = (pointer)&buf.field_2;
    buf._M_string_length = 0;
    buf.field_2._M_local_buf[0] = '\0';
    path_00 = (pbVar4->_M_dataplus)._M_p;
    local_98 = (_Manager_type)0x0;
    p_Stack_90 = (_Invoker_type)0x0;
    mtime = 0;
    uStack_a0 = 0;
    mtime = (uint64_t)operator_new(0x20);
    size = (uint64_t)&group_local;
    *(uint64_t *)mtime = size;
    *(string **)(mtime + 8) = &buf;
    *(pointer *)(mtime + 0x10) = pbVar4;
    *(vector<FileInfo,_std::allocator<FileInfo>_> **)(mtime + 0x18) = files_00;
    p_Stack_90 = std::
                 _Function_handler<void_(const_char_*,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:316:51)>
                 ::_M_invoke;
    local_78 = 0;
    local_98 = std::
               _Function_handler<void_(const_char_*,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:316:51)>
               ::_M_manager;
    local_68 = std::
               _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:322:7)>
               ::_M_invoke;
    local_70 = std::
               _Function_handler<bool_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/project.cpp:322:7)>
               ::_M_manager;
    bVar3 = traverseDirectory(path_00,(function<void_(const_char_*,_unsigned_long,_unsigned_long)> *
                                      )&mtime,(function<bool_(const_char_*)> *)&size);
    std::_Function_base::~_Function_base((_Function_base *)&size);
    std::_Function_base::~_Function_base((_Function_base *)&mtime);
    if (!bVar3) {
      (*output->_vptr_Output[4])(output,"Error reading folder %s\n",(pbVar4->_M_dataplus)._M_p);
    }
    std::__cxx11::string::~string((string *)&buf);
  }
  puVar2 = (group_local->groups).
           super__Vector_base<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (group_local->groups).
                super__Vector_base<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>,_std::allocator<std::unique_ptr<ProjectGroup,_std::default_delete<ProjectGroup>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    getProjectGroupFilesRec
              (output,(puVar5->_M_t).
                      super___uniq_ptr_impl<ProjectGroup,_std::default_delete<ProjectGroup>_>._M_t.
                      super__Tuple_impl<0UL,_ProjectGroup_*,_std::default_delete<ProjectGroup>_>.
                      super__Head_base<0UL,_ProjectGroup_*,_false>._M_head_impl,files_00);
  }
  return;
}

Assistant:

static void getProjectGroupFilesRec(Output* output, ProjectGroup* group, std::vector<FileInfo>& files)
{
	for (auto& path: group->files)
	{
		uint64_t mtime, size;

		if (getFileAttributes(path.c_str(), &mtime, &size))
			files.push_back({ path, mtime, size });
		else
			output->error("Error reading metadata for file %s\n", path.c_str());
	}

	for (auto& folder: group->paths)
	{
		std::string buf;

		bool result = traverseDirectory(folder.c_str(), [&](const char* path, uint64_t mtime, uint64_t size) {
			if (isFileAcceptable(group, path))
			{
				joinPaths(buf, folder.c_str(), path);
				files.push_back({ buf, mtime, size });
			}
			}, [&](const char* path) {
				return isDirectoryAcceptable(group, path);
			});

		if (!result) output->error("Error reading folder %s\n", folder.c_str());
	}

	for (auto& child: group->groups)
		getProjectGroupFilesRec(output, child.get(), files);
}